

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O0

void __thiscall
cuckoocache_tests::GenerationsTest::
test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>(GenerationsTest *this)

{
  bool bVar1;
  size_type sVar2;
  vector<block_activity,_std::allocator<block_activity>_> *this_00;
  long in_FS_OFFSET;
  pair<unsigned_int,_unsigned_long> pVar3;
  double hit;
  uint32_t k;
  block_activity *act;
  deque<block_activity,_std::allocator<block_activity>_> *__range3;
  uint32_t count;
  uint32_t i;
  uint32_t total;
  uint32_t out_of_tight_tolerance;
  uint32_t n_insert;
  size_t bytes;
  size_t megabytes;
  double load;
  uint32_t POP_AMOUNT;
  uint32_t WINDOW_SIZE;
  double max_rate_less_than_tight_hit_rate;
  double tight_hit_rate;
  double min_hit_rate;
  iterator __end0;
  iterator __begin0;
  deque<block_activity,_std::allocator<block_activity>_> last_few;
  vector<block_activity,_std::allocator<block_activity>_> hashes;
  uint32_t BLOCK_SIZE;
  cache<uint256,_SignatureCacheHasher> set;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  FastRandomContext *in_stack_fffffffffffffd18;
  uint *in_stack_fffffffffffffd20;
  BasicTestingSetup *in_stack_fffffffffffffd28;
  const_string *in_stack_fffffffffffffd30;
  uint256 *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  uint local_294;
  uint local_280;
  uint local_27c;
  const_string local_208 [2];
  const_string local_190 [2];
  lazy_ostream local_170;
  assertion_result local_150 [9];
  undefined4 local_6c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest
            (in_stack_fffffffffffffd28,(SeedRand)((ulong)in_stack_fffffffffffffd20 >> 0x20));
  local_6c = 1000;
  std::vector<block_activity,_std::allocator<block_activity>_>::vector
            ((vector<block_activity,_std::allocator<block_activity>_> *)in_stack_fffffffffffffd08);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffd28);
  pVar3 = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
                    ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffd28,
                     (size_t)in_stack_fffffffffffffd20);
  this_00 = (vector<block_activity,_std::allocator<block_activity>_> *)pVar3.second;
  std::vector<block_activity,_std::allocator<block_activity>_>::reserve
            (this_00,CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  std::deque<block_activity,_std::allocator<block_activity>_>::deque
            ((deque<block_activity,_std::allocator<block_activity>_> *)in_stack_fffffffffffffd08);
  for (local_27c = 0; local_27c < 0x51e; local_27c = local_27c + 1) {
    sVar2 = std::deque<block_activity,_std::allocator<block_activity>_>::size
                      ((deque<block_activity,_std::allocator<block_activity>_> *)
                       in_stack_fffffffffffffd08);
    if (sVar2 == 0x3c) {
      std::deque<block_activity,_std::allocator<block_activity>_>::pop_front
                ((deque<block_activity,_std::allocator<block_activity>_> *)in_stack_fffffffffffffd08
                );
    }
    std::
    deque<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity,std::allocator<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity>>
    ::
    emplace_back<unsigned_int_const&,FastRandomContext&,CuckooCache::cache<uint256,SignatureCacheHasher>&>
              ((deque<block_activity,_std::allocator<block_activity>_> *)in_stack_fffffffffffffd28,
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (cache<uint256,_SignatureCacheHasher> *)
               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    local_280 = 0;
    std::deque<block_activity,_std::allocator<block_activity>_>::begin
              ((deque<block_activity,_std::allocator<block_activity>_> *)
               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    std::deque<block_activity,_std::allocator<block_activity>_>::end
              ((deque<block_activity,_std::allocator<block_activity>_> *)
               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd18,
                                   (_Self *)CONCAT17(in_stack_fffffffffffffd17,
                                                     in_stack_fffffffffffffd10)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      std::_Deque_iterator<block_activity,_block_activity_&,_block_activity_*>::operator*
                ((_Deque_iterator<block_activity,_block_activity_&,_block_activity_*> *)
                 in_stack_fffffffffffffd08);
      for (local_294 = 0; local_294 < 8; local_294 = local_294 + 1) {
        std::vector<uint256,_std::allocator<uint256>_>::back(&in_stack_fffffffffffffd08->table);
        in_stack_fffffffffffffd47 =
             CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                       ((cache<uint256,_SignatureCacheHasher> *)
                        CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                        in_stack_fffffffffffffd38,SUB81((ulong)in_stack_fffffffffffffd30 >> 0x38,0))
        ;
        local_280 = (byte)in_stack_fffffffffffffd47 + local_280;
        std::vector<uint256,_std::allocator<uint256>_>::pop_back(&in_stack_fffffffffffffd08->table);
      }
      std::_Deque_iterator<block_activity,_block_activity_&,_block_activity_*>::operator++
                ((_Deque_iterator<block_activity,_block_activity_&,_block_activity_*> *)
                 in_stack_fffffffffffffd08);
    }
    in_stack_fffffffffffffd38 = (uint256 *)(double)local_280;
    std::deque<block_activity,_std::allocator<block_activity>_>::size
              ((deque<block_activity,_std::allocator<block_activity>_> *)in_stack_fffffffffffffd08);
    do {
      in_stack_fffffffffffffd30 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this_00,
                 (const_string *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (size_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      in_stack_fffffffffffffd28 = (BasicTestingSetup *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd08 = (cache<uint256,_SignatureCacheHasher> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_150,&local_170,local_190,0x16e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd08);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (unsigned_long)in_stack_fffffffffffffd08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,
               (const_string *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (size_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
    in_stack_fffffffffffffd18 = (FastRandomContext *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (unsigned_long)in_stack_fffffffffffffd08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               (unsigned_long)in_stack_fffffffffffffd08);
    in_stack_fffffffffffffd08 = (cache<uint256,_SignatureCacheHasher> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe38,(lazy_ostream *)&stack0xfffffffffffffe18
               ,local_208,0x175,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffd08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::deque<block_activity,_std::allocator<block_activity>_>::~deque
            ((deque<block_activity,_std::allocator<block_activity>_> *)in_stack_fffffffffffffd18);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(in_stack_fffffffffffffd08);
  std::vector<block_activity,_std::allocator<block_activity>_>::~vector
            ((vector<block_activity,_std::allocator<block_activity>_> *)in_stack_fffffffffffffd18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void test_cache_generations()
{
    // This test checks that for a simulation of network activity, the fresh hit
    // rate is never below 99%, and the number of times that it is worse than
    // 99.9% are less than 1% of the time.
    double min_hit_rate = 0.99;
    double tight_hit_rate = 0.999;
    double max_rate_less_than_tight_hit_rate = 0.01;
    // A cache that meets this specification is therefore shown to have a hit
    // rate of at least tight_hit_rate * (1 - max_rate_less_than_tight_hit_rate) +
    // min_hit_rate*max_rate_less_than_tight_hit_rate = 0.999*99%+0.99*1% == 99.89%
    // hit rate with low variance.

    // We use deterministic values, but this test has also passed on many
    // iterations with non-deterministic values, so it isn't "overfit" to the
    // specific entropy in FastRandomContext(true) and implementation of the
    // cache.
    SeedRandomForTest(SeedRand::ZEROS);

    // block_activity models a chunk of network activity. n_insert elements are
    // added to the cache. The first and last n/4 are stored for removal later
    // and the middle n/2 are not stored. This models a network which uses half
    // the signatures of recently (since the last block) added transactions
    // immediately and never uses the other half.
    struct block_activity {
        std::vector<uint256> reads;
        block_activity(uint32_t n_insert, FastRandomContext& rng, Cache& c)
        {
            std::vector<uint256> inserts;
            inserts.resize(n_insert);
            reads.reserve(n_insert / 2);
            for (uint32_t i = 0; i < n_insert; ++i) {
                uint32_t* ptr = (uint32_t*)inserts[i].begin();
                for (uint8_t j = 0; j < 8; ++j)
                    *(ptr++) = rng.rand32();
            }
            for (uint32_t i = 0; i < n_insert / 4; ++i)
                reads.push_back(inserts[i]);
            for (uint32_t i = n_insert - (n_insert / 4); i < n_insert; ++i)
                reads.push_back(inserts[i]);
            for (const auto& h : inserts)
                c.insert(h);
        }
    };

    const uint32_t BLOCK_SIZE = 1000;
    // We expect window size 60 to perform reasonably given that each epoch
    // stores 45% of the cache size (~472k).
    const uint32_t WINDOW_SIZE = 60;
    const uint32_t POP_AMOUNT = (BLOCK_SIZE / WINDOW_SIZE) / 2;
    const double load = 10;
    const size_t megabytes = 4;
    const size_t bytes = megabytes * (1 << 20);
    const uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));

    std::vector<block_activity> hashes;
    Cache set{};
    set.setup_bytes(bytes);
    hashes.reserve(n_insert / BLOCK_SIZE);
    std::deque<block_activity> last_few;
    uint32_t out_of_tight_tolerance = 0;
    uint32_t total = n_insert / BLOCK_SIZE;
    // we use the deque last_few to model a sliding window of blocks. at each
    // step, each of the last WINDOW_SIZE block_activities checks the cache for
    // POP_AMOUNT of the hashes that they inserted, and marks these erased.
    for (uint32_t i = 0; i < total; ++i) {
        if (last_few.size() == WINDOW_SIZE)
            last_few.pop_front();
        last_few.emplace_back(BLOCK_SIZE, m_rng, set);
        uint32_t count = 0;
        for (auto& act : last_few)
            for (uint32_t k = 0; k < POP_AMOUNT; ++k) {
                count += set.contains(act.reads.back(), true);
                act.reads.pop_back();
            }
        // We use last_few.size() rather than WINDOW_SIZE for the correct
        // behavior on the first WINDOW_SIZE iterations where the deque is not
        // full yet.
        double hit = (double(count)) / (last_few.size() * POP_AMOUNT);
        // Loose Check that hit rate is above min_hit_rate
        BOOST_CHECK(hit > min_hit_rate);
        // Tighter check, count number of times we are less than tight_hit_rate
        // (and implicitly, greater than min_hit_rate)
        out_of_tight_tolerance += hit < tight_hit_rate;
    }
    // Check that being out of tolerance happens less than
    // max_rate_less_than_tight_hit_rate of the time
    BOOST_CHECK(double(out_of_tight_tolerance) / double(total) < max_rate_less_than_tight_hit_rate);
}